

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperLib.c
# Opt level: O3

Map_SuperLib_t *
Map_SuperLibCreate(Mio_Library_t *pGenlib,Vec_Str_t *vStr,char *pFileName,char *pExcludeFile,
                  int fAlgorithm,int fVerbose)

{
  int iVar1;
  Map_SuperLib_t *pLib;
  size_t sVar2;
  char *__dest;
  Extra_MmFixed_t *pEVar3;
  Extra_MmFlex_t *pEVar4;
  Map_HashTable_t *pMVar5;
  Mio_Gate_t *pMVar6;
  Map_Super_t *pMVar7;
  long lVar8;
  int level;
  long lVar9;
  float fVar10;
  float fVar11;
  timespec ts;
  timespec local_40;
  
  lVar9 = 1;
  pLib = (Map_SuperLib_t *)calloc(1,0xb8);
  if (pFileName == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar2 = strlen(pFileName);
    __dest = (char *)malloc(sVar2 + 1);
    strcpy(__dest,pFileName);
  }
  pLib->pName = __dest;
  pLib->fVerbose = fVerbose;
  pEVar3 = Extra_MmFixedStart(0x100);
  pLib->mmSupers = pEVar3;
  pEVar3 = Extra_MmFixedStart(0x20);
  pLib->mmEntries = pEVar3;
  pEVar4 = Extra_MmFlexStart();
  pLib->mmForms = pEVar4;
  Map_MappingSetupTruthTables(pLib->uTruths);
  pMVar5 = Map_SuperTableCreate(pLib);
  pLib->tTableC = pMVar5;
  pMVar5 = Map_SuperTableCreate(pLib);
  pLib->tTable = pMVar5;
  iVar1 = clock_gettime(3,&local_40);
  if (-1 < iVar1) {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (vStr == (Vec_Str_t *)0x0) {
    if (fAlgorithm == 0) {
      if (pExcludeFile != (char *)0x0) {
        Map_SuperLibFree(pLib);
        puts("Error: Exclude file support not present for old format. Stop.");
        return (Map_SuperLib_t *)0x0;
      }
      iVar1 = Map_LibraryRead(pLib,pFileName);
    }
    else {
      iVar1 = Map_LibraryReadTree(pLib,pGenlib,pFileName,pExcludeFile);
    }
    if (iVar1 != 0) goto LAB_003fe6d3;
  }
  else {
    iVar1 = Map_LibraryReadFileTreeStr(pLib,pGenlib,vStr,pFileName);
    if ((iVar1 != 0) && (iVar1 = Map_LibraryDeriveGateInfo(pLib,(st__table *)0x0), iVar1 != 0)) {
      if (pLib->nVarsMax < 1) {
        __assert_fail("p->nVarsMax > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperLib.c"
                      ,0x5f,
                      "Map_SuperLib_t *Map_SuperLibCreate(Mio_Library_t *, Vec_Str_t *, char *, char *, int, int)"
                     );
      }
LAB_003fe6d3:
      if (pLib->nVarsMax < 1) {
        __assert_fail("p->nVarsMax > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperLib.c"
                      ,0x77,
                      "Map_SuperLib_t *Map_SuperLibCreate(Mio_Library_t *, Vec_Str_t *, char *, char *, int, int)"
                     );
      }
      if (fVerbose != 0) {
        iVar1 = 0x9b3ffd;
        printf("Loaded %d unique %d-input supergates from \"%s\".  ",(ulong)(uint)pLib->nSupersReal,
               (ulong)(uint)pLib->nVarsMax,pFileName);
        Abc_Print(iVar1,"%s =","Time");
        level = 3;
        iVar1 = clock_gettime(3,&local_40);
        if (iVar1 < 0) {
          lVar8 = -1;
        }
        else {
          lVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        Abc_Print(level,"%9.2f sec\n",(double)(lVar8 + lVar9) / 1000000.0);
      }
      pMVar6 = Mio_LibraryReadInv(pLib->pGenlib);
      pLib->pGateInv = pMVar6;
      fVar10 = Mio_LibraryReadDelayInvRise(pLib->pGenlib);
      (pLib->tDelayInv).Rise = fVar10;
      fVar11 = Mio_LibraryReadDelayInvFall(pLib->pGenlib);
      (pLib->tDelayInv).Fall = fVar11;
      fVar10 = (pLib->tDelayInv).Rise;
      if (fVar10 <= fVar11) {
        fVar10 = fVar11;
      }
      (pLib->tDelayInv).Worst = fVar10;
      fVar10 = Mio_LibraryReadAreaInv(pLib->pGenlib);
      pLib->AreaInv = fVar10;
      fVar10 = Mio_LibraryReadAreaBuf(pLib->pGenlib);
      pLib->AreaBuf = fVar10;
      pMVar7 = (Map_Super_t *)Extra_MmFixedEntryFetch(pLib->mmSupers);
      pLib->pSuperInv = pMVar7;
      memset(pMVar7->uPhases,0,0xf8);
      *(undefined8 *)pMVar7 = 0x20ffffffff;
      *(uint *)&pLib->pSuperInv->field_0x4 = *(uint *)&pLib->pSuperInv->field_0x4 & 0xffffffe3 | 4;
      *(uint *)&pLib->pSuperInv->field_0x4 =
           *(uint *)&pLib->pSuperInv->field_0x4 & 0xfffff0ff | 0xa00;
      pLib->pSuperInv->pFanins[0] = *pLib->ppSupers;
      pMVar7 = pLib->pSuperInv;
      pMVar7->pRoot = pLib->pGateInv;
      pMVar7->Area = pLib->AreaInv;
      (pMVar7->tDelayMax).Worst = (pLib->tDelayInv).Worst;
      fVar10 = (pLib->tDelayInv).Fall;
      (pMVar7->tDelayMax).Rise = (pLib->tDelayInv).Rise;
      (pMVar7->tDelayMax).Fall = fVar10;
      pMVar7 = pLib->pSuperInv;
      pMVar7->tDelaysR[0].Rise = -9999.0;
      pMVar7->tDelaysR[0].Fall = (pLib->tDelayInv).Rise;
      pMVar7->tDelaysF[0].Rise = (pLib->tDelayInv).Fall;
      pMVar7->tDelaysF[0].Fall = -9999.0;
      return pLib;
    }
  }
  Map_SuperLibFree(pLib);
  return (Map_SuperLib_t *)0x0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reads in the supergate library and prepares it for use.]

  Description [The supergates library comes in a .super file. This file
  contains descriptions of supergates along with some relevant information.
  This procedure reads the supergate file, canonicizes the supergates,
  and constructs an additional lookup table, which can be used to map
  truth tables of the cuts into the pair (phase, supergate). The phase
  indicates how the current truth table should be phase assigned to 
  match the canonical form of the supergate. The resulting phase is the
  bitwise EXOR of the phase needed to canonicize the supergate and the
  phase needed to transform the truth table into its canonical form.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Map_SuperLib_t * Map_SuperLibCreate( Mio_Library_t * pGenlib, Vec_Str_t * vStr, char * pFileName, char * pExcludeFile, int fAlgorithm, int fVerbose )
{
    Map_SuperLib_t * p;
    abctime clk;

    // start the supergate library
    p = ABC_ALLOC( Map_SuperLib_t, 1 );
    memset( p, 0, sizeof(Map_SuperLib_t) );
    p->pName     = Abc_UtilStrsav(pFileName);
    p->fVerbose  = fVerbose;
    p->mmSupers  = Extra_MmFixedStart( sizeof(Map_Super_t) );
    p->mmEntries = Extra_MmFixedStart( sizeof(Map_HashEntry_t) );
    p->mmForms   = Extra_MmFlexStart();
    Map_MappingSetupTruthTables( p->uTruths );

    // start the hash table
    p->tTableC = Map_SuperTableCreate( p );
    p->tTable  = Map_SuperTableCreate( p );

    // read the supergate library from file
clk = Abc_Clock();
    if ( vStr != NULL )
    {
        // read the supergate library from file
        int Status = Map_LibraryReadFileTreeStr( p, pGenlib, vStr, pFileName );
        if ( Status == 0 )
        {
            Map_SuperLibFree( p );
            return NULL;
        }
        // prepare the info about the library
        Status = Map_LibraryDeriveGateInfo( p, NULL );
        if ( Status == 0 )
        {
            Map_SuperLibFree( p );
            return NULL;
        }
        assert( p->nVarsMax > 0 );
    }
    else if ( fAlgorithm )
    {
        if ( !Map_LibraryReadTree( p, pGenlib, pFileName, pExcludeFile ) )
        {
            Map_SuperLibFree( p );
            return NULL;
        }
    }
    else
    {
        if ( pExcludeFile != 0 )
        {
            Map_SuperLibFree( p );
            printf ("Error: Exclude file support not present for old format. Stop.\n");
            return NULL;
        }
        if ( !Map_LibraryRead( p, pFileName ) )
        {
            Map_SuperLibFree( p );
            return NULL;
        }
    }
    assert( p->nVarsMax > 0 );

    // report the stats
    if ( fVerbose ) 
    {
        printf( "Loaded %d unique %d-input supergates from \"%s\".  ", 
            p->nSupersReal, p->nVarsMax, pFileName );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // assign the interver parameters
    p->pGateInv        = Mio_LibraryReadInv( p->pGenlib );
    p->tDelayInv.Rise  = Mio_LibraryReadDelayInvRise( p->pGenlib );
    p->tDelayInv.Fall  = Mio_LibraryReadDelayInvFall( p->pGenlib );
    p->tDelayInv.Worst = MAP_MAX( p->tDelayInv.Rise, p->tDelayInv.Fall );
    p->AreaInv         = Mio_LibraryReadAreaInv( p->pGenlib );
    p->AreaBuf         = Mio_LibraryReadAreaBuf( p->pGenlib );

    // assign the interver supergate
    p->pSuperInv = (Map_Super_t *)Extra_MmFixedEntryFetch( p->mmSupers );
    memset( p->pSuperInv, 0, sizeof(Map_Super_t) );
    p->pSuperInv->Num         = -1;
    p->pSuperInv->nGates      =  1;
    p->pSuperInv->nFanins     =  1;
    p->pSuperInv->nFanLimit   = 10;
    p->pSuperInv->pFanins[0]  = p->ppSupers[0];
    p->pSuperInv->pRoot       = p->pGateInv;
    p->pSuperInv->Area        = p->AreaInv;
    p->pSuperInv->tDelayMax   = p->tDelayInv;
    p->pSuperInv->tDelaysR[0].Rise = MAP_NO_VAR;
    p->pSuperInv->tDelaysR[0].Fall = p->tDelayInv.Rise;
    p->pSuperInv->tDelaysF[0].Rise = p->tDelayInv.Fall;
    p->pSuperInv->tDelaysF[0].Fall = MAP_NO_VAR;
    return p;
}